

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::SQVM(SQVM *this,SQSharedState *ss)

{
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQVM_00144418;
  (this->_stack)._allocated = 0;
  (this->_stack)._vals = (SQObjectPtr *)0x0;
  (this->_stack)._size = 0;
  (this->_roottable).super_SQObject._type = OT_NULL;
  (this->_roottable).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_lasterror).super_SQObject._type = OT_NULL;
  (this->_lasterror).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_errorhandler).super_SQObject._type = OT_NULL;
  (this->_errorhandler).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_debughook_closure).super_SQObject._type = OT_NULL;
  (this->_debughook_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->temp_reg).super_SQObject._type = OT_NULL;
  (this->temp_reg).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_callstackdata)._vals = (CallInfo *)0x0;
  (this->_callstackdata)._size = 0;
  (this->_callstackdata)._allocated = 0;
  (this->_etraps)._vals = (SQExceptionTrap *)0x0;
  (this->_etraps)._size = 0;
  (this->_etraps)._allocated = 0;
  this->_sharedstate = ss;
  this->_suspended = 0;
  this->_suspended_target = -1;
  this->_suspended_root = 0;
  this->_suspended_traps = -1;
  this->_foreignptr = (SQUserPointer)0x0;
  this->_nnativecalls = 0;
  this->_nmetamethodscall = 0;
  SQObjectPtr::Null(&this->_lasterror);
  SQObjectPtr::Null(&this->_errorhandler);
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  SQObjectPtr::Null(&this->_debughook_closure);
  this->_openouters = (SQOuter *)0x0;
  this->ci = (CallInfo *)0x0;
  this->_releasehook = (SQRELEASEHOOK)0x0;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  this->_sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQVM::SQVM(SQSharedState *ss)
{
    _sharedstate=ss;
    _suspended = SQFalse;
    _suspended_target = -1;
    _suspended_root = SQFalse;
    _suspended_traps = -1;
    _foreignptr = NULL;
    _nnativecalls = 0;
    _nmetamethodscall = 0;
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    _openouters = NULL;
    ci = NULL;
    _releasehook = NULL;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}